

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringExtraTest_InternalSwap_Test::TestBody
          (MicroStringExtraTest_InternalSwap_Test *this)

{
  undefined1 uVar1;
  string_view data;
  string_view data_00;
  long lVar2;
  size_t sVar3;
  size_t size;
  char *pcVar4;
  AssertionResult gtest_ar;
  MicroStringExtra<15> rhs;
  MicroStringExtra<15> lhs;
  string_view rhs_value;
  size_t used_rhs;
  size_t used_lhs;
  string_view lhs_value;
  AssertHelper local_90;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  string_view local_78;
  MicroString local_68 [2];
  MicroString local_58 [2];
  basic_string_view<char,_std::char_traits<char>_> local_48;
  size_t local_38;
  size_t local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_len = 0x5a;
  local_28._M_str =
       "Very long string that is not SSO and unlikely to use the same capacity as the other value.";
  local_48._M_len = 0xf;
  local_48._M_str = "123456789012345";
  local_58[0].rep_ = (void *)0x0;
  local_68[0].rep_ = (void *)0x0;
  data_00._M_str =
       "Very long string that is not SSO and unlikely to use the same capacity as the other value.";
  data_00._M_len = 0x5a;
  MicroString::SetImpl(local_58,data_00,(Arena *)0x0,0xf);
  data._M_str = local_48._M_str;
  data._M_len = local_48._M_len;
  MicroString::SetImpl(local_68,data,(Arena *)0x0,0xf);
  local_30 = MicroString::SpaceUsedExcludingSelfLong(local_58);
  local_38 = MicroString::SpaceUsedExcludingSelfLong(local_68);
  local_78 = MicroString::Get(local_58);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (local_88,"lhs.Get()","lhs_value",&local_78,&local_28);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x3f3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
  }
  else {
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_78 = MicroString::Get(local_68);
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (local_88,"rhs.Get()","rhs_value",&local_78,&local_48);
    if (local_88[0] != (internal)0x0) {
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      lVar2 = 0;
      do {
        uVar1 = *(undefined1 *)((long)&local_58[0].rep_ + lVar2);
        *(undefined1 *)((long)&local_58[0].rep_ + lVar2) =
             *(undefined1 *)((long)&local_68[0].rep_ + lVar2);
        *(undefined1 *)((long)&local_68[0].rep_ + lVar2) = uVar1;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x10);
      local_78 = MicroString::Get(local_58);
      testing::internal::
      CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (local_88,"lhs.Get()","rhs_value",&local_78,&local_48);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar4 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0x3f8,pcVar4);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)local_78._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_78._M_len + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_78 = MicroString::Get(local_68);
      testing::internal::
      CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (local_88,"rhs.Get()","lhs_value",&local_78,&local_28);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar4 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0x3f9,pcVar4);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)local_78._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_78._M_len + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      sVar3 = MicroString::SpaceUsedExcludingSelfLong(local_58);
      local_78._M_len = sVar3;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_88,"used_rhs","lhs.SpaceUsedExcludingSelfLong()",&local_38,&local_78._M_len);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar4 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0x3fa,pcVar4);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)local_78._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_78._M_len + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      sVar3 = MicroString::SpaceUsedExcludingSelfLong(local_68);
      local_78._M_len = sVar3;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_88,"used_lhs","rhs.SpaceUsedExcludingSelfLong()",&local_30,&local_78._M_len);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar4 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0x3fb,pcVar4);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)local_78._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_78._M_len + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      if (((ulong)local_58[0].rep_ & 3) != 0) {
        MicroString::DestroySlow(local_58);
      }
      if (((ulong)local_68[0].rep_ & 3) == 0) {
        return;
      }
      MicroString::DestroySlow(local_68);
      return;
    }
    testing::Message::Message((Message *)&local_78);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x3f4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if ((long *)local_78._M_len != (long *)0x0) {
    (**(code **)(*(long *)local_78._M_len + 8))();
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  return;
}

Assistant:

TEST_F(MicroStringExtraTest, InternalSwap) {
  constexpr absl::string_view lhs_value =
      "Very long string that is not SSO and unlikely to use the same capacity "
      "as the other value.";
  constexpr absl::string_view rhs_value = "123456789012345";

  MicroStringExtra<15> lhs, rhs;
  lhs.Set(lhs_value, nullptr);
  rhs.Set(rhs_value, nullptr);

  const size_t used_lhs = lhs.SpaceUsedExcludingSelfLong();
  const size_t used_rhs = rhs.SpaceUsedExcludingSelfLong();

  // Verify setup.
  ASSERT_EQ(lhs.Get(), lhs_value);
  ASSERT_EQ(rhs.Get(), rhs_value);

  lhs.InternalSwap(&rhs);

  EXPECT_EQ(lhs.Get(), rhs_value);
  EXPECT_EQ(rhs.Get(), lhs_value);
  EXPECT_EQ(used_rhs, lhs.SpaceUsedExcludingSelfLong());
  EXPECT_EQ(used_lhs, rhs.SpaceUsedExcludingSelfLong());

  lhs.Destroy();
  rhs.Destroy();
}